

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O1

int trans_scanner_block_cmp_fn(ScannerBlock *a,ScannerBlock *b,hash_fns_t *fns)

{
  ScanStateTransition *pSVar1;
  ScanStateTransition *pSVar2;
  void *pvVar3;
  
  if (0 < (long)fns->data[0]) {
    pvVar3 = (void *)0x0;
    do {
      pSVar1 = a->transitions[(long)pvVar3];
      pSVar2 = b->transitions[(long)pvVar3];
      if (pSVar1 != pSVar2) {
        if (pSVar1 == (ScanStateTransition *)0x0) {
          return 1;
        }
        if (pSVar2 == (ScanStateTransition *)0x0) {
          return 1;
        }
        if (pSVar1->index != pSVar2->index) {
          return 1;
        }
      }
      pvVar3 = (void *)((long)pvVar3 + 1);
    } while (fns->data[0] != pvVar3);
  }
  return 0;
}

Assistant:

static int trans_scanner_block_cmp_fn(ScannerBlock *a, ScannerBlock *b, hash_fns_t *fns) {
  intptr_t i, block_size = (intptr_t)fns->data[0];
  ScanStateTransition **sa = a->transitions;
  ScanStateTransition **sb = b->transitions;

  for (i = 0; i < block_size; i++) {
    if (sa[i] == sb[i]) continue;
    if (!sa[i] || !sb[i]) return 1;
    if (sa[i]->index != sb[i]->index) return 1;
  }
  return 0;
}